

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.hpp
# Opt level: O0

FRAMEBUFFER_TARGET_FLAGS Diligent::operator&(FRAMEBUFFER_TARGET_FLAGS a,FRAMEBUFFER_TARGET_FLAGS b)

{
  FRAMEBUFFER_TARGET_FLAGS b_local;
  FRAMEBUFFER_TARGET_FLAGS a_local;
  
  return a & b;
}

Assistant:

void TextureBaseGL::TextureMemoryBarrier(MEMORY_BARRIER RequiredBarriers, GLContextState& GLContextState)
{
#if GL_ARB_shader_image_load_store
#    ifdef DILIGENT_DEBUG
    {
        constexpr Uint32 TextureBarriers = MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;
        VERIFY((RequiredBarriers & TextureBarriers) != 0, "At least one texture memory barrier flag should be set");
        VERIFY((RequiredBarriers & ~TextureBarriers) == 0, "Inappropriate texture memory barrier flag");
    }
#    endif

    GLContextState.EnsureMemoryBarrier(RequiredBarriers, this);
#endif
}